

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestCoverageHandler.cxx
# Opt level: O3

bool __thiscall
cmCTestCoverageHandler::ShouldIDoCoverage
          (cmCTestCoverageHandler *this,char *file,char *srcDir,char *binDir)

{
  cmCTest *pcVar1;
  _Alloc_hider fname;
  bool bVar2;
  bool bVar3;
  int iVar4;
  ostream *poVar5;
  size_t sVar6;
  long *plVar7;
  cmSystemTools *remote;
  size_type *psVar8;
  char *in_R8;
  pointer this_00;
  string fFile;
  string checkDir;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string fSrcDir;
  string relPath;
  string ndc;
  string fileDir;
  string fBinDir;
  ostringstream cmCTestLog_msg;
  string local_2a8;
  cmSystemTools *local_288;
  size_t local_280;
  cmSystemTools local_278;
  undefined7 uStack_277;
  long *local_268 [2];
  long local_258 [2];
  string local_248;
  char *local_228;
  undefined8 local_220;
  char local_218;
  undefined7 uStack_217;
  string local_208;
  string local_1e8;
  string local_1c8;
  undefined1 local_1a8 [112];
  ios_base local_138 [264];
  
  std::__cxx11::string::string((string *)local_1a8,file,(allocator *)&local_248);
  bVar2 = IsFilteredOut(this,(string *)local_1a8);
  if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
    operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
  }
  if (bVar2) {
LAB_00271d3a:
    bVar2 = false;
  }
  else {
    for (this_00 = (this->CustomCoverageExcludeRegex).
                   super__Vector_base<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        this_00 !=
        (this->CustomCoverageExcludeRegex).
        super__Vector_base<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>.
        _M_impl.super__Vector_impl_data._M_finish; this_00 = this_00 + 1) {
      bVar2 = cmsys::RegularExpression::find(this_00,file);
      if (bVar2) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"  File ",7);
        if (file == (char *)0x0) {
          std::ios::clear((int)&local_2a8 + (int)*(undefined8 *)(local_1a8._0_8_ + -0x18) + 0x100);
        }
        else {
          sVar6 = strlen(file);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,file,sVar6);
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8," is excluded in CTestCustom.ctest",0x21);
        std::ios::widen((char)(ostream *)local_1a8 + (char)*(undefined8 *)(local_1a8._0_8_ + -0x18))
        ;
        std::ostream::put((char)local_1a8);
        std::ostream::flush();
        pcVar1 = (this->super_cmCTestGenericHandler).CTest;
        std::__cxx11::stringbuf::str();
        cmCTest::Log(pcVar1,3,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Source/CTest/cmCTestCoverageHandler.cxx"
                     ,0xee,local_248._M_dataplus._M_p,(this->super_cmCTestGenericHandler).Quiet);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_248._M_dataplus._M_p != &local_248.field_2) {
          operator_delete(local_248._M_dataplus._M_p,local_248.field_2._M_allocated_capacity + 1);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
        std::ios_base::~ios_base(local_138);
        goto LAB_00271d3a;
      }
    }
    std::__cxx11::string::string((string *)local_1a8,srcDir,(allocator *)&local_1c8);
    cmsys::SystemTools::CollapseFullPath(&local_248,(string *)local_1a8);
    if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
      operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
    }
    std::__cxx11::string::string((string *)local_1a8,binDir,(allocator *)&local_2a8);
    cmsys::SystemTools::CollapseFullPath(&local_1c8,(string *)local_1a8);
    if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
      operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
    }
    std::__cxx11::string::string((string *)local_1a8,file,(allocator *)&local_1e8);
    cmsys::SystemTools::CollapseFullPath(&local_2a8,(string *)local_1a8);
    if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
      operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
    }
    bVar2 = cmsys::SystemTools::IsSubDirectory(&local_2a8,&local_248);
    bVar3 = cmsys::SystemTools::IsSubDirectory(&local_2a8,&local_1c8);
    cmsys::SystemTools::GetFilenamePath(&local_1e8,&local_2a8);
    local_288 = &local_278;
    local_280 = 0;
    local_278 = (cmSystemTools)0x0;
    if ((bVar2 && bVar3) || (bVar3 || bVar2)) {
      std::__cxx11::string::_M_assign((string *)&local_288);
    }
    remote = local_288;
    cmSystemTools::FileExistsInParentDirectories_abi_cxx11_
              (&local_208,(cmSystemTools *)".NoDartCoverage",local_2a8._M_dataplus._M_p,
               (char *)local_288,in_R8);
    if (local_208._M_string_length == 0) {
      local_220 = 0;
      local_218 = '\0';
      local_228 = &local_218;
      if (local_280 == 0) {
        std::__cxx11::string::_M_assign((string *)&local_228);
      }
      else {
        cmSystemTools::RelativePath_abi_cxx11_
                  ((string *)local_1a8,local_288,local_2a8._M_dataplus._M_p,(char *)remote);
        std::__cxx11::string::operator=((string *)&local_228,(string *)local_1a8);
        if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
          operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
        }
      }
      if ((local_280 == local_248._M_string_length) && (local_280 != 0)) {
        bcmp(local_288,local_248._M_dataplus._M_p,local_280);
      }
      std::__cxx11::string::_M_assign((string *)&local_288);
      local_268[0] = local_258;
      std::__cxx11::string::_M_construct<char*>((string *)local_268,local_288,local_288 + local_280)
      ;
      std::__cxx11::string::append((char *)local_268);
      plVar7 = (long *)std::__cxx11::string::_M_append((char *)local_268,(ulong)local_228);
      psVar8 = (size_type *)(plVar7 + 2);
      if ((size_type *)*plVar7 == psVar8) {
        local_1a8._16_8_ = *psVar8;
        local_1a8._24_8_ = plVar7[3];
        local_1a8._0_8_ = local_1a8 + 0x10;
      }
      else {
        local_1a8._16_8_ = *psVar8;
        local_1a8._0_8_ = (size_type *)*plVar7;
      }
      local_1a8._8_8_ = plVar7[1];
      *plVar7 = (long)psVar8;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      std::__cxx11::string::operator=((string *)&local_2a8,(string *)local_1a8);
      if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
        operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
      }
      if (local_268[0] != local_258) {
        operator_delete(local_268[0],local_258[0] + 1);
      }
      cmsys::SystemTools::GetFilenamePath((string *)local_1a8,&local_2a8);
      std::__cxx11::string::operator=((string *)&local_2a8,(string *)local_1a8);
      if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
        operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
      }
      fname._M_p = local_2a8._M_dataplus._M_p;
      if ((local_1e8._M_string_length != local_2a8._M_string_length) ||
         ((bVar2 = true, local_1e8._M_string_length != 0 &&
          (iVar4 = bcmp(local_1e8._M_dataplus._M_p,local_2a8._M_dataplus._M_p,
                        local_1e8._M_string_length), iVar4 != 0)))) {
        cmSystemTools::FileExistsInParentDirectories_abi_cxx11_
                  ((string *)local_1a8,(cmSystemTools *)".NoDartCoverage",fname._M_p,
                   (char *)local_288,in_R8);
        std::__cxx11::string::operator=((string *)&local_208,(string *)local_1a8);
        if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
          operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
        }
        if (local_208._M_string_length == 0) {
          bVar2 = true;
        }
        else {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"Found: ",7);
          poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)local_1a8,local_208._M_dataplus._M_p,
                              local_208._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar5," so skip coverage of: ",0x16);
          if (file == (char *)0x0) {
            std::ios::clear((int)poVar5 + (int)poVar5->_vptr_basic_ostream[-3]);
          }
          else {
            sVar6 = strlen(file);
            std::__ostream_insert<char,std::char_traits<char>>(poVar5,file,sVar6);
          }
          std::ios::widen((char)poVar5->_vptr_basic_ostream[-3] + (char)poVar5);
          std::ostream::put((char)poVar5);
          std::ostream::flush();
          pcVar1 = (this->super_cmCTestGenericHandler).CTest;
          std::__cxx11::stringbuf::str();
          cmCTest::Log(pcVar1,3,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Source/CTest/cmCTestCoverageHandler.cxx"
                       ,0x13f,(char *)local_268[0],(this->super_cmCTestGenericHandler).Quiet);
          if (local_268[0] != local_258) {
            operator_delete(local_268[0],local_258[0] + 1);
          }
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
          std::ios_base::~ios_base(local_138);
          bVar2 = false;
        }
      }
      if (local_228 != &local_218) {
        operator_delete(local_228,CONCAT71(uStack_217,local_218) + 1);
      }
    }
    else {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"Found: ",7);
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_1a8,local_208._M_dataplus._M_p,local_208._M_string_length
                         );
      std::__ostream_insert<char,std::char_traits<char>>(poVar5," so skip coverage of ",0x15);
      if (file == (char *)0x0) {
        std::ios::clear((int)poVar5 + (int)poVar5->_vptr_basic_ostream[-3]);
      }
      else {
        sVar6 = strlen(file);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,file,sVar6);
      }
      std::ios::widen((char)poVar5->_vptr_basic_ostream[-3] + (char)poVar5);
      std::ostream::put((char)poVar5);
      std::ostream::flush();
      pcVar1 = (this->super_cmCTestGenericHandler).CTest;
      std::__cxx11::stringbuf::str();
      cmCTest::Log(pcVar1,3,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Source/CTest/cmCTestCoverageHandler.cxx"
                   ,0x118,local_228,(this->super_cmCTestGenericHandler).Quiet);
      if (local_228 != &local_218) {
        operator_delete(local_228,CONCAT71(uStack_217,local_218) + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
      std::ios_base::~ios_base(local_138);
      bVar2 = false;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_208._M_dataplus._M_p != &local_208.field_2) {
      operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
    }
    if (local_288 != &local_278) {
      operator_delete(local_288,CONCAT71(uStack_277,local_278) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
      operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2a8._M_dataplus._M_p != &local_2a8.field_2) {
      operator_delete(local_2a8._M_dataplus._M_p,local_2a8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
      operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_248._M_dataplus._M_p != &local_248.field_2) {
      operator_delete(local_248._M_dataplus._M_p,local_248.field_2._M_allocated_capacity + 1);
    }
  }
  return bVar2;
}

Assistant:

bool cmCTestCoverageHandler::ShouldIDoCoverage(const char* file,
  const char* srcDir,
  const char* binDir)
{
  if(this->IsFilteredOut(file))
    {
    return false;
    }

  std::vector<cmsys::RegularExpression>::iterator sit;
  for ( sit = this->CustomCoverageExcludeRegex.begin();
    sit != this->CustomCoverageExcludeRegex.end(); ++ sit )
    {
    if ( sit->find(file) )
      {
      cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT, "  File " << file
        << " is excluded in CTestCustom.ctest" << std::endl;, this->Quiet);
      return false;
      }
    }

  std::string fSrcDir = cmSystemTools::CollapseFullPath(srcDir);
  std::string fBinDir = cmSystemTools::CollapseFullPath(binDir);
  std::string fFile = cmSystemTools::CollapseFullPath(file);
  bool sourceSubDir = cmSystemTools::IsSubDirectory(fFile,
    fSrcDir);
  bool buildSubDir = cmSystemTools::IsSubDirectory(fFile,
    fBinDir);
  // Always check parent directory of the file.
  std::string fileDir = cmSystemTools::GetFilenamePath(fFile);
  std::string checkDir;

  // We also need to check the binary/source directory pair.
  if ( sourceSubDir && buildSubDir )
    {
    if ( fSrcDir.size() > fBinDir.size() )
      {
      checkDir = fSrcDir;
      }
    else
      {
      checkDir = fBinDir;
      }
    }
  else if ( sourceSubDir )
    {
    checkDir = fSrcDir;
    }
  else if ( buildSubDir )
    {
    checkDir = fBinDir;
    }
  std::string ndc
    = cmSystemTools::FileExistsInParentDirectories(".NoDartCoverage",
      fFile.c_str(), checkDir.c_str());
  if (!ndc.empty())
    {
    cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT, "Found: " << ndc
      << " so skip coverage of " << file << std::endl, this->Quiet);
    return false;
    }

  // By now checkDir should be set to parent directory of the file.
  // Get the relative path to the file an apply it to the opposite directory.
  // If it is the same as fileDir, then ignore, otherwise check.
  std::string relPath;
  if(!checkDir.empty())
    {
    relPath = cmSystemTools::RelativePath(checkDir.c_str(),
                                          fFile.c_str());
    }
  else
    {
    relPath = fFile;
    }
  if ( checkDir == fSrcDir )
    {
    checkDir = fBinDir;
    }
  else
    {
    checkDir = fSrcDir;
    }
  fFile = checkDir + "/" + relPath;
  fFile = cmSystemTools::GetFilenamePath(fFile);

  if ( fileDir == fFile )
    {
    // This is in-source build, so we trust the previous check.
    return true;
    }

  ndc = cmSystemTools::FileExistsInParentDirectories(".NoDartCoverage",
    fFile.c_str(), checkDir.c_str());
  if (!ndc.empty())
    {
    cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT, "Found: " << ndc
      << " so skip coverage of: " << file << std::endl, this->Quiet);
    return false;
    }
  // Ok, nothing in source tree, nothing in binary tree
  return true;
}